

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileReader.cpp
# Opt level: O0

bool __thiscall
KeyFileReader<NWN::ResRef16>::GetEncapsulatedFileEntry
          (KeyFileReader<NWN::ResRef16> *this,FileId FileIndex,ResRefIf *ResRef,ResType *Type)

{
  PCKEY_RESOURCE_DESCRIPTOR p_Var1;
  KeyFileReader<NWN::ResRef16> *in_RCX;
  undefined8 *in_RDX;
  bool bVar2;
  PCKEY_RESOURCE_DESCRIPTOR ResKey;
  ResID in_stack_ffffffffffffffd0;
  
  p_Var1 = LookupResourceKey(in_RCX,in_stack_ffffffffffffffd0);
  bVar2 = p_Var1 != (PCKEY_RESOURCE_DESCRIPTOR)0x0;
  if (bVar2) {
    memset(in_RDX,0,0x20);
    *in_RDX = *(undefined8 *)(p_Var1->Res).ResRef.RefStr;
    in_RDX[1] = *(undefined8 *)((p_Var1->Res).ResRef.RefStr + 8);
    *(ResType *)&(in_RCX->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor =
         (p_Var1->Res).ResourceType;
  }
  return bVar2;
}

Assistant:

bool
KeyFileReader< ResRefT >::GetEncapsulatedFileEntry(
	 typename KeyFileReader< ResRefT >::FileId FileIndex,
     ResRefIf & ResRef,
	 ResType & Type
	)
/*++

Routine Description:

	This routine reads an encapsulated file directory entry, returning the name
	and type of a particular resource.  The enumeration is stable across calls.

Arguments:

	FileIndex - Supplies the index into the logical directory entry to reutrn.

	ResRef - Receives the resource name.

	Type - Receives the resource type.

Return Value:

	The routine returns a Boolean value indicating success or failure.  The
	routine always succeeds as long as the caller provides a legal file index.

Environment:

	User mode.

--*/
{
	PCKEY_RESOURCE_DESCRIPTOR ResKey;

	ResKey = LookupResourceKey( (ResID) FileIndex );

	if (ResKey == NULL)
		return false;

	ZeroMemory( &ResRef, sizeof( ResRef ) );
	memcpy( &ResRef, &ResKey->Res.ResRef, sizeof( ResKey->Res.ResRef ) );
	Type = ResKey->Res.ResourceType;

	return true;
}